

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

void set_color_index_map_offset(MACROBLOCKD *xd,int plane,aom_reader *r)

{
  BLOCK_SIZE BVar1;
  byte bVar2;
  byte bVar3;
  
  BVar1 = (*xd->mi)->bsize;
  bVar2 = block_size_high[BVar1] >> ((byte)xd->plane[plane].subsampling_y & 0x1f);
  bVar3 = block_size_wide[BVar1] >> ((byte)xd->plane[plane].subsampling_x & 0x1f);
  xd->color_index_map_offset[plane] =
       xd->color_index_map_offset[plane] +
       ((ushort)bVar2 + (ushort)(bVar2 < 4 && 0 < plane) * 2) *
       ((ushort)bVar3 + (ushort)(bVar3 < 4 && 0 < plane) * 2);
  return;
}

Assistant:

static inline void set_color_index_map_offset(MACROBLOCKD *const xd, int plane,
                                              aom_reader *r) {
  (void)r;
  Av1ColorMapParam params;
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  av1_get_block_dimensions(mbmi->bsize, plane, xd, &params.plane_width,
                           &params.plane_height, NULL, NULL);
  xd->color_index_map_offset[plane] += params.plane_width * params.plane_height;
}